

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubroutineUniform::SubroutineUniform
          (SubroutineUniform *this,UniformValueGenerator *generator,
          SubroutineFunctionSet *_functions,Loc _location,
          vector<int,_std::allocator<int>_> *_arraySizesSegmented,DefOccurence _defOccurence,
          bool _used)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 uVar5;
  int local_26c;
  undefined1 local_268 [4];
  int i_1;
  UniformValue local_1d8;
  ulong local_100;
  size_t i;
  byte local_51;
  vector<int,_std::allocator<int>_> *pvStack_50;
  bool _used_local;
  vector<int,_std::allocator<int>_> *_arraySizesSegmented_local;
  SubroutineFunctionSet *_functions_local;
  UniformValueGenerator *generator_local;
  SubroutineUniform *this_local;
  undefined8 uStack_28;
  DefOccurence _defOccurence_local;
  Loc _location_local;
  
  uVar5 = _location.super_LayoutSpecifierBase._0_8_;
  this_local._4_4_ = _defOccurence.occurence;
  local_51 = _used;
  pvStack_50 = _arraySizesSegmented;
  _arraySizesSegmented_local = (vector<int,_std::allocator<int>_> *)_functions;
  _functions_local = (SubroutineFunctionSet *)generator;
  generator_local = (UniformValueGenerator *)this;
  uStack_28 = uVar5;
  SubroutineFunctionSet::SubroutineFunctionSet(&this->functions,_functions);
  (this->location).super_LayoutSpecifierBase.occurence.occurence =
       _location.super_LayoutSpecifierBase.occurence.occurence.occurence;
  (this->location).super_LayoutSpecifierBase.val = (int)uVar5;
  (this->location).super_LayoutSpecifierBase.numSys = (int)((ulong)uVar5 >> 0x20);
  (this->defOccurence).occurence = this_local._4_4_;
  this->used = (bool)(local_51 & 1);
  std::vector<int,_std::allocator<int>_>::vector(&this->arraySizesSegmented,_arraySizesSegmented);
  this->isArray = true;
  UniformType::UniformType((UniformType *)&i,0x1405,0);
  UniformValue::UniformValue
            (&this->embeddedUIntUniform,(UniformType *)&i,(UniformValueGenerator *)_functions_local)
  ;
  UniformType::~UniformType((UniformType *)&i);
  std::__cxx11::string::string((string *)&this->name);
  this->arraySize = 1;
  local_100 = 0;
  while( true ) {
    uVar2 = local_100;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->arraySizesSegmented);
    if (sVar3 <= uVar2) {
      UniformType::UniformType((UniformType *)local_268,0x1405,this->arraySize);
      UniformValue::UniformValue
                (&local_1d8,(UniformType *)local_268,(UniformValueGenerator *)_functions_local);
      UniformValue::operator=(&this->embeddedUIntUniform,&local_1d8);
      UniformValue::~UniformValue(&local_1d8);
      UniformType::~UniformType((UniformType *)local_268);
      for (local_26c = 0; local_26c < this->arraySize; local_26c = local_26c + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(this->embeddedUIntUniform).uValues,(long)local_26c);
        iVar1 = *pvVar4;
        sVar3 = std::
                vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ::size((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                        *)this);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(this->embeddedUIntUniform).uValues,(long)local_26c);
        *pvVar4 = (value_type)((ulong)(long)iVar1 % sVar3);
      }
      return;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->arraySizesSegmented,local_100);
    if (*pvVar4 < 1) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->arraySizesSegmented,local_100);
    this->arraySize = *pvVar4 * this->arraySize;
    local_100 = local_100 + 1;
  }
  __assert_fail("arraySizesSegmented[i] > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x34e,
                "glcts::(anonymous namespace)::SubroutineUniform::SubroutineUniform(UniformValueGenerator &, SubroutineFunctionSet &, Loc, std::vector<int>, DefOccurence, bool)"
               );
}

Assistant:

SubroutineUniform(UniformValueGenerator& generator, SubroutineFunctionSet& _functions, Loc _location,
					  std::vector<int> _arraySizesSegmented, DefOccurence _defOccurence = DefOccurence::ALL_SH,
					  bool _used = true)
		: functions(_functions)
		, location(_location)
		, defOccurence(_defOccurence)
		, used(_used)
		, arraySizesSegmented(_arraySizesSegmented)
		, isArray(true)
		, embeddedUIntUniform(GL_UNSIGNED_INT, generator)
	{

		arraySize = 1;
		for (size_t i = 0; i < arraySizesSegmented.size(); i++)
		{
			assert(arraySizesSegmented[i] > 0);
			arraySize *= arraySizesSegmented[i];
		}

		embeddedUIntUniform = UniformValue(UniformType(GL_UNSIGNED_INT, arraySize), generator);
		for (int i = 0; i < arraySize; i++)
		{
			embeddedUIntUniform.uValues[i] = static_cast<GLint>(embeddedUIntUniform.uValues[i] % functions.fn.size());
		}
	}